

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

int32_t spvOpcodeReturnsLogicalPointer(Op opcode)

{
  if ((int)opcode < 0x1142) {
    if ((0x1c < opcode - OpFunctionParameter) ||
       ((0x10000c31U >> (opcode - OpFunctionParameter & 0x1f) & 1) == 0)) {
      return 0;
    }
  }
  else if (((2 < opcode - OpUntypedVariableKHR) && (opcode != OpAllocateNodePayloadsAMDX)) &&
          (opcode != OpRawAccessChainNV)) {
    return 0;
  }
  return 1;
}

Assistant:

int32_t spvOpcodeReturnsLogicalPointer(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
    case spv::Op::OpFunctionParameter:
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpCopyObject:
    case spv::Op::OpRawAccessChainNV:
    case spv::Op::OpAllocateNodePayloadsAMDX:
      return true;
    default:
      return false;
  }
}